

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_randomizer_adaptations.hpp
# Opt level: O1

void PatchRandomizerAdaptations::prevent_hint_item_save_scumming(ROM *rom)

{
  uint32_t uVar1;
  Code *pCVar2;
  Code func_save_on_buy;
  undefined1 local_128 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_e0;
  Param local_a8;
  undefined8 local_a0;
  Code local_98;
  
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._0_8_ = &PTR_getXn_00261cd8;
  local_128._8_8_ = (pointer)0x200001592;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::jsr(&local_98,(Param *)local_128);
  local_a8._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_a0 = 0x200ff1903;
  local_128._0_8_ = &PTR_getXn_00261c98;
  local_128._8_8_ = (pointer)0xff;
  md::Code::move(&local_98,(Param *)local_128,&local_a8,BYTE);
  md::Code::rts(&local_98);
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
  uVar1 = md::ROM::inject_code(rom,&local_98,(string *)local_128);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_110._M_impl.super__Rb_tree_header._M_header;
  _Stack_e0._M_impl._0_8_ = 0;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._16_8_ = 0;
  _Stack_110._M_impl._0_8_ = 0;
  local_128._0_8_ = (_func_int **)0x0;
  local_128._8_8_ = (pointer)0x0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_e0._M_impl.super__Rb_tree_header._M_header;
  _Stack_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_a0 = CONCAT44(2,uVar1);
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_110._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar2 = md::Code::jsr((Code *)local_128,&local_a8);
  pCVar2 = md::Code::nop(pCVar2,1);
  md::ROM::set_code(rom,0x24f48,pCVar2);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_e0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_110);
  if ((_func_int **)local_128._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_98._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98._pending_branches._M_t);
  if (local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void prevent_hint_item_save_scumming(md::ROM& rom)
    {
        md::Code func_save_on_buy;
        {
            func_save_on_buy.jsr(0x1592);                   // Save game
            func_save_on_buy.moveb(0xFF, addr_(0xFF1903));  // Redo instruction that was removed by injection
        }
        func_save_on_buy.rts();
        uint32_t func_save_on_buy_addr = rom.inject_code(func_save_on_buy);

        rom.set_code(0x24F48, md::Code().jsr(func_save_on_buy_addr).nop());
    }